

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O0

void __thiscall
PS2KeyboardAnalyzerResults::GenerateExportFile
          (PS2KeyboardAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  double dVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulonglong uVar5;
  ulong uVar6;
  ostream *poVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  U8 Zmovement;
  U8 FourthButton;
  U8 FifthButton;
  U8 Ymovement;
  U8 Xmovement;
  U8 LeftButton;
  U8 RightButton;
  U8 MiddleButton;
  U8 XSignBit;
  U8 YSignBit;
  U8 XOverflow;
  U8 YOverflow;
  char key_str_2 [512];
  char codetype_1 [32];
  char tmp_str_1 [256];
  char num_str_2 [128];
  char key_str_1 [64];
  char codetype [32];
  char tmp_str [128];
  char num_str_1 [128];
  char result_str [255];
  char cmd_str [64];
  char num_str [128];
  char device_str [16];
  char time_str [128];
  ulonglong local_350;
  Frame frame_2;
  ulonglong local_340;
  ulong local_338;
  byte local_32f;
  uint local_324;
  U32 i_2;
  U64 num_frames_2;
  Frame frame_1;
  uint local_2ec;
  U32 i_1;
  U64 num_frames_1;
  char local_2d8 [8];
  char key_str [64];
  Frame frame;
  U64 local_288;
  ulong local_280;
  byte local_277;
  uint local_26c;
  U32 i;
  U64 num_frames;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  PS2KeyboardAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  uVar5 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  if (export_type_user_id == 0) {
    dVar1 = this->mSettings->mDeviceType;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      uVar6 = AnalyzerResults::GetNumFrames();
      for (local_2ec = 0; local_2ec < uVar6; local_2ec = local_2ec + 1) {
        AnalyzerResults::GetFrame((ulonglong)&num_frames_2);
        bVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                          ((ulonglong)this,(ulong)local_2ec);
        bVar15 = (bVar3 & 1) == 1;
        if (bVar15) {
          std::ofstream::close();
        }
        Frame::~Frame((Frame *)&num_frames_2);
        if (bVar15) goto LAB_0010a25d;
      }
    }
    else {
      uVar6 = AnalyzerResults::GetNumFrames();
      for (local_26c = 0; local_26c < uVar6; local_26c = local_26c + 1) {
        AnalyzerResults::GetFrame((ulonglong)(key_str + 0x38));
        GetKey(this,local_2d8,local_288,local_277 & 8);
        if ((local_277 & 2) == 0) {
          if ((local_277 & 0x80) == 0) {
            if ((local_277 & 0x40) == 0) {
              if (((local_277 & 0x20) == 0) || ((local_277 & 0x10) == 0)) {
                if ((local_277 & 0x20) == 0) {
                  if (((local_277 & 8) == 0) || ((local_277 & 0x10) == 0)) {
                    if ((local_277 & 0x10) != 0) {
                      sprintf(local_2d8,"");
                    }
                  }
                  else {
                    sprintf(local_2d8,"");
                  }
                }
                else {
                  sprintf(local_2d8,"[PRINT SCREEN]");
                }
              }
              else {
                sprintf(local_2d8,"");
              }
            }
            else {
              sprintf(local_2d8,"[PAUSE/BREAK]");
            }
          }
          else {
            sprintf(local_2d8,"");
          }
        }
        else if ((local_280 & 1) == 0) {
          if ((local_280 & 2) == 0) {
            if ((local_280 & 4) != 0) {
              sprintf(local_2d8,"");
            }
          }
          else {
            sprintf(local_2d8,"");
          }
        }
        else {
          sprintf(local_2d8,"");
        }
        std::operator<<((ostream *)&trigger_sample,local_2d8);
        bVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                          ((ulonglong)this,(ulong)local_26c);
        bVar15 = (bVar3 & 1) == 1;
        if (bVar15) {
          std::ofstream::close();
        }
        Frame::~Frame((Frame *)(key_str + 0x38));
        if (bVar15) goto LAB_0010a25d;
      }
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&trigger_sample,
                             "Time [s], Originator, Type, Details, Raw Data");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    uVar6 = AnalyzerResults::GetNumFrames();
    for (local_324 = 0; local_324 < uVar6; local_324 = local_324 + 1) {
      AnalyzerResults::GetFrame((ulonglong)&local_350);
      AnalyzerHelpers::GetTimeString(local_350,uVar5,uVar4,device_str + 8,0x80);
      if ((local_32f & 1) == 0) {
        dVar1 = this->mSettings->mDeviceType;
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          sprintf(num_str + 0x78,"Mouse");
          GetKeyName(this,(char *)&Xmovement,local_340,local_32f & 8);
          if ((local_32f & 2) == 0) {
            if ((local_32f & 0x20) == 0) {
              AnalyzerHelpers::GetNumberString(local_340,Hexadecimal,8,tmp_str_1 + 0xf8,0x80);
              sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
              sprintf(key_str_2 + 0x1f8,"DATA");
              sprintf((char *)&Xmovement,"");
            }
            else {
              AnalyzerHelpers::GetNumberString(local_340,Hexadecimal,0x20,tmp_str_1 + 0xf8,0x80);
              sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
              sprintf(key_str_2 + 0x1f8,"MOVEMENT");
              uVar11 = (local_340 & 0x80) >> 7;
              uVar12 = (local_340 & 0x40) >> 6;
              uVar13 = (local_340 & 0x20) >> 5;
              uVar14 = (local_340 & 0x10) >> 4;
              bVar8 = (byte)((local_340 & 4) >> 2);
              bVar9 = (byte)((local_340 & 2) >> 1);
              bVar10 = (byte)local_340 & 1;
              bVar3 = (byte)(local_340 >> 8);
              bVar2 = (byte)(local_340 >> 0x10);
              dVar1 = this->mSettings->mDeviceType;
              if ((dVar1 != 1.0) || (NAN(dVar1))) {
                sprintf((char *)&Xmovement,
                        "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d"
                        ,uVar11,uVar12,uVar13,uVar14,(uint)bVar8,(uint)bVar9,(uint)bVar10,0,
                        (uint)(byte)((local_340 & 0x20000000) >> 0x1d),(uint)bVar3,(uint)bVar2,
                        (uint)((byte)(local_340 >> 0x18) & 0xf));
              }
              else {
                sprintf((char *)&Xmovement,
                        "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, deltaX: %d, deltaY: %d"
                        ,uVar11,uVar12,uVar13,uVar14,(uint)bVar8,(uint)bVar9,(uint)bVar10,
                        (uint)bVar3,(uint)bVar2);
              }
            }
          }
          else if ((local_338 & 1) == 0) {
            if ((local_338 & 4) != 0) {
              AnalyzerHelpers::GetNumberString(local_340,Hexadecimal,8,tmp_str_1 + 0xf8,0x80);
              sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
              sprintf(key_str_2 + 0x1f8,"BAT");
              sprintf((char *)&Xmovement,"Power-On Self Test Successfull");
            }
          }
          else {
            AnalyzerHelpers::GetNumberString(local_340,Hexadecimal,8,tmp_str_1 + 0xf8,0x80);
            sprintf(codetype_1 + 0x18,"%s",tmp_str_1 + 0xf8);
            sprintf(key_str_2 + 0x1f8,"ACK");
            sprintf((char *)&Xmovement,"");
          }
          sprintf(tmp_str_1 + 0xf8,"%s",codetype_1 + 0x18);
          poVar7 = std::operator<<((ostream *)&trigger_sample,device_str + 8);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,num_str + 0x78);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,key_str_2 + 0x1f8);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,(char *)&Xmovement);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,tmp_str_1 + 0xf8);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          sprintf(num_str + 0x78,"Keyboard");
          AnalyzerHelpers::GetNumberString(local_340,Hexadecimal,8,tmp_str + 0x78,0x20);
          GetKeyName(this,num_str_2 + 0x78,local_340,local_32f & 8);
          if ((local_32f & 2) == 0) {
            if ((local_32f & 0x80) == 0) {
              if ((local_32f & 0x40) == 0) {
                if (((local_32f & 0x20) == 0) || ((local_32f & 0x10) == 0)) {
                  if ((local_32f & 0x20) == 0) {
                    if (((local_32f & 8) == 0) || ((local_32f & 0x10) == 0)) {
                      if ((local_32f & 8) == 0) {
                        if ((local_32f & 0x10) == 0) {
                          sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
                          sprintf(key_str_1 + 0x38,"MAKE");
                        }
                        else {
                          sprintf(codetype + 0x18,"0xF0, %s",tmp_str + 0x78);
                          sprintf(key_str_1 + 0x38,"BREAK");
                        }
                      }
                      else {
                        sprintf(codetype + 0x18,"0xE0, %s",tmp_str + 0x78);
                        sprintf(key_str_1 + 0x38,"MAKE");
                      }
                    }
                    else {
                      sprintf(codetype + 0x18,"0xE0, 0xF0, %s",tmp_str + 0x78);
                      sprintf(key_str_1 + 0x38,"BREAK");
                    }
                  }
                  else {
                    sprintf(codetype + 0x18,"0xE0, 0x12, 0xE0, 0x7C");
                    sprintf(key_str_1 + 0x38,"MAKE");
                    sprintf(num_str_2 + 0x78,"[PRINT SCREEN]");
                  }
                }
                else {
                  sprintf(codetype + 0x18,"0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12");
                  sprintf(key_str_1 + 0x38,"BREAK");
                  sprintf(num_str_2 + 0x78,"[PRINT SCREEN]");
                }
              }
              else {
                sprintf(codetype + 0x18,"0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77");
                sprintf(key_str_1 + 0x38,"");
                sprintf(num_str_2 + 0x78,"[PAUSE/BREAK]");
              }
            }
            else {
              sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
              sprintf(key_str_1 + 0x38,"ERROR");
              sprintf(num_str_2 + 0x78,"INVALID CODE");
            }
          }
          else if ((local_338 & 1) == 0) {
            if ((local_338 & 2) == 0) {
              if ((local_338 & 4) != 0) {
                sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
                sprintf(key_str_1 + 0x38,"BAT");
                sprintf(num_str_2 + 0x78,"Power-On Self Test Successfull");
              }
            }
            else {
              sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
              sprintf(key_str_1 + 0x38,"ECHO");
              sprintf(num_str_2 + 0x78,"");
            }
          }
          else {
            sprintf(codetype + 0x18,"%s",tmp_str + 0x78);
            sprintf(key_str_1 + 0x38,"ACK");
            sprintf(num_str_2 + 0x78,"");
          }
          sprintf(tmp_str + 0x78,"%s",codetype + 0x18);
          poVar7 = std::operator<<((ostream *)&trigger_sample,device_str + 8);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,num_str + 0x78);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,key_str_1 + 0x38);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,num_str_2 + 0x78);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = std::operator<<(poVar7,tmp_str + 0x78);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        sprintf(num_str + 0x78,"Host");
        AnalyzerHelpers::GetNumberString(local_340,Hexadecimal,8,cmd_str + 0x38,0x20);
        GetCommandName(this,result_str + 0xf8,local_340,this->mSettings->mDeviceType);
        sprintf(num_str_1 + 0x78,"%s: %s (%s)",num_str + 0x78,result_str + 0xf8,cmd_str + 0x38);
        poVar7 = std::operator<<((ostream *)&trigger_sample,device_str + 8);
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::operator<<(poVar7,num_str + 0x78);
        poVar7 = std::operator<<(poVar7,",,");
        poVar7 = std::operator<<(poVar7,result_str + 0xf8);
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::operator<<(poVar7,cmd_str + 0x38);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      bVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                        ((ulonglong)this,(ulong)local_324);
      bVar15 = (bVar3 & 1) == 1;
      if (bVar15) {
        std::ofstream::close();
      }
      Frame::~Frame((Frame *)&local_350);
      if (bVar15) goto LAB_0010a25d;
    }
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
  std::ofstream::close();
LAB_0010a25d:
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    if( export_type_user_id == 0 )
    {
        if( mSettings->mDeviceType == 0 )
        {
            // keys as text file, no output for mouse
            U64 num_frames = GetNumFrames();
            for( U32 i = 0; i < num_frames; i++ )
            {
                Frame frame = GetFrame( i );

                char key_str[ 64 ];

                // set the key based on the data, then if the context of the transmissions means its not correct, just make it an empty
                // string
                GetKey( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

                // context checking, only allows make codes to generate a character in the file
                if( frame.mFlags & DATA_FRAME )
                {
                    if( frame.mData2 & ACK_FRAME )
                        sprintf( key_str, "" );
                    else if( frame.mData2 & ECHO_FRAME )
                        sprintf( key_str, "" );
                    else if( frame.mData2 & BAT_FRAME )
                        sprintf( key_str, "" );
                }
                else if( frame.mFlags & ERROR_FRAME )
                    sprintf( key_str, "" );
                else if( frame.mFlags & PAUSE_BREAK )
                    sprintf( key_str, "[PAUSE/BREAK]" );
                else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );
                else if( frame.mFlags & PRINT_SCREEN )
                    sprintf( key_str, "[PRINT SCREEN]" );
                else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );
                else if( frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );

                file_stream << key_str;

                if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
                {
                    file_stream.close();
                    return;
                }
            }
        }
        else
        {
            // no output for mouse, but don't want the program to crash so put this here for stability
            U64 num_frames = GetNumFrames();
            for( U32 i = 0; i < num_frames; i++ )
            {
                Frame frame = GetFrame( i );

                if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
                {
                    file_stream.close();
                    return;
                }
            }
        }
    }
    else
    {
        // csv data log file, mouse & keyboard support

        // print column titles
        file_stream << "Time [s], Originator, Type, Details, Raw Data" << std::endl;

        U64 num_frames = GetNumFrames();
        for( U32 i = 0; i < num_frames; i++ )
        {
            Frame frame = GetFrame( i );

            char time_str[ 128 ];
            AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

            char device_str[ 16 ];
            if( frame.mFlags & TX_HOST_TO_DEVICE )
            {
                sprintf( device_str, "Host" );

                char num_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

                char cmd_str[ 64 ];
                GetCommandName( cmd_str, frame.mData1, mSettings->mDeviceType );

                char result_str[ 255 ];

                // add key str
                sprintf( result_str, "%s: %s (%s)", device_str, cmd_str, num_str );

                file_stream << time_str << "," << device_str << ",," << cmd_str << "," << num_str << std::endl;
            }
            else
            {
                if( mSettings->mDeviceType == 0 )
                {
                    sprintf( device_str, "Keyboard" );

                    char num_str[ 128 ];
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

                    char tmp_str[ 128 ];
                    char codetype[ 32 ];

                    char key_str[ 64 ];
                    GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );


                    if( frame.mFlags & DATA_FRAME )
                    {
                        if( frame.mData2 & ACK_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ACK" );
                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & ECHO_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ECHO" );

                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & BAT_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "BAT" );

                            sprintf( key_str, "Power-On Self Test Successfull" );
                        }
                    }
                    else if( frame.mFlags & ERROR_FRAME )
                    {
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "ERROR" );
                        sprintf( key_str, "INVALID CODE" );
                    }
                    else if( frame.mFlags & PAUSE_BREAK )
                    {
                        sprintf( tmp_str, "0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77" );
                        sprintf( codetype, "" );
                        sprintf( key_str, "[PAUSE/BREAK]" );
                    }
                    else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12" );
                        sprintf( codetype, "BREAK" );
                        sprintf( key_str, "[PRINT SCREEN]" );
                    }
                    else if( frame.mFlags & PRINT_SCREEN )
                    {
                        sprintf( tmp_str, "0xE0, 0x12, 0xE0, 0x7C" );
                        sprintf( codetype, "MAKE" );
                        sprintf( key_str, "[PRINT SCREEN]" );
                    }
                    else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xE0, 0xF0, %s", num_str );
                        sprintf( codetype, "BREAK" );
                    }
                    else if( frame.mFlags & EXTENDED_KEY )
                    {
                        sprintf( tmp_str, "0xE0, %s", num_str );
                        sprintf( codetype, "MAKE" );
                    }
                    else if( frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xF0, %s", num_str );
                        sprintf( codetype, "BREAK" );
                    }
                    else
                    {
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "MAKE" );
                    }

                    sprintf( num_str, "%s", tmp_str );

                    // write the info to the file
                    file_stream << time_str << "," << device_str << "," << codetype << "," << key_str << "," << num_str << std::endl;
                }
                else
                {
                    sprintf( device_str, "Mouse" );

                    char num_str[ 128 ];

                    char tmp_str[ 256 ];
                    char codetype[ 32 ];

                    char key_str[ 512 ];
                    GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

                    if( frame.mFlags & DATA_FRAME )
                    {
                        if( frame.mData2 & ACK_FRAME )
                        {
                            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ACK" );
                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & BAT_FRAME )
                        {
                            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "BAT" );

                            sprintf( key_str, "Power-On Self Test Successfull" );
                        }
                    }
                    else if( frame.mFlags & MOVEMENT_FRAME )
                    {
                        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 32, num_str, 128 );
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "MOVEMENT" );

                        U8 YOverflow = ( frame.mData1 & 0x80 ) >> 7;
                        U8 XOverflow = ( frame.mData1 & 0x40 ) >> 6;
                        U8 YSignBit = ( frame.mData1 & 0x20 ) >> 5;
                        U8 XSignBit = ( frame.mData1 & 0x10 ) >> 4;
                        U8 MiddleButton = ( frame.mData1 & 0x04 ) >> 2;
                        U8 RightButton = ( frame.mData1 & 0x02 ) >> 1;
                        U8 LeftButton = frame.mData1 & 0x01;

                        U8 Xmovement = ( frame.mData1 & 0xFF00 ) >> 8;
                        U8 Ymovement = ( frame.mData1 & 0xFF0000 ) >> 16;

                        if( mSettings->mDeviceType == 1 )
                            sprintf( key_str,
                                     "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left "
                                     "Btn: %d, deltaX: %d, deltaY: %d",
                                     YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, Xmovement,
                                     Ymovement );
                        else
                        {
                            U8 FifthButton = ( frame.mData1 & 0x20000000 ) >> 29;
                            U8 FourthButton = ( frame.mData1 & 0x1000000 ) >> 28;
                            U8 Zmovement = ( frame.mData1 & 0x0F000000 ) >> 24;

                            sprintf( key_str,
                                     "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left "
                                     "Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d",
                                     YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, FourthButton,
                                     FifthButton, Xmovement, Ymovement, Zmovement );
                        }
                    }
                    else
                    {
                        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "DATA" );

                        sprintf( key_str, "" );
                    }
                    sprintf( num_str, "%s", tmp_str );

                    file_stream << time_str << "," << device_str << "," << codetype << "," << key_str << "," << num_str << std::endl;
                }
            }

            if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
            {
                file_stream.close();
                return;
            }
        }
    }

    UpdateExportProgressAndCheckForCancel( 0, 0 );
    file_stream.close();
}